

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo.cpp
# Opt level: O3

void __thiscall DSBarInfo::~DSBarInfo(DSBarInfo *this)

{
  ~DSBarInfo(this);
  M_Free(this);
  return;
}

Assistant:

~DSBarInfo ()
	{
		Images.Uninit();
	}